

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::UnifiedCache::get<icu_63::CollationCacheEntry>
          (UnifiedCache *this,CacheKey<icu_63::CollationCacheEntry> *key,void *creationContext,
          CollationCacheEntry **ptr,UErrorCode *status)

{
  CollationCacheEntry *this_00;
  UErrorCode creationStatus;
  SharedObject *value;
  UErrorCode local_2c;
  CollationCacheEntry *local_28;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  local_2c = U_ZERO_ERROR;
  local_28 = (CollationCacheEntry *)0x0;
  _get(this,&key->super_CacheKeyBase,(SharedObject **)&local_28,creationContext,&local_2c);
  this_00 = local_28;
  if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
    SharedObject::copyPtr<icu_63::CollationCacheEntry>(local_28,ptr);
  }
  if (this_00 != (CollationCacheEntry *)0x0) {
    SharedObject::removeRef(&this_00->super_SharedObject);
  }
  if ((*status == U_ZERO_ERROR) || (U_ZERO_ERROR < local_2c)) {
    *status = local_2c;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }